

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_LForward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long lVar3;
  longdouble lVar4;
  longdouble lVar5;
  complex<long_double> __r;
  complex<long_double> local_a8;
  TPZMatrix<std::complex<long_double>_> *local_88;
  long local_80;
  undefined4 local_78 [8];
  complex<long_double> local_58;
  
  lVar3 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar3 != CONCAT44(extraout_var,iVar1)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LForward incompatible dimensions\n",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
    lVar3 = 0;
    local_88 = this;
    do {
      if (0 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) {
        lVar2 = 0;
        do {
          lVar4 = (longdouble)0;
          lVar5 = lVar4;
          local_80 = lVar2;
          if (lVar3 != 0) {
            lVar2 = 0;
            lVar4 = (longdouble)0;
            lVar5 = lVar4;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_78,this,lVar3,lVar2);
              (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])(&local_58,B,lVar2,local_80);
              local_a8._M_value._16_4_ = local_78[4];
              local_a8._M_value._20_4_ = local_78[5];
              local_a8._M_value._24_2_ = SUB42(local_78[6],0);
              local_a8._M_value._26_2_ = SUB42((uint)local_78[6] >> 0x10,0);
              local_a8._M_value._28_4_ = local_78[7];
              local_a8._M_value._0_4_ = local_78[0];
              local_a8._M_value._4_4_ = local_78[1];
              local_a8._M_value._8_2_ = SUB42(local_78[2],0);
              local_a8._M_value._10_2_ = SUB42((uint)local_78[2] >> 0x10,0);
              local_a8._M_value._12_4_ = local_78[3];
              std::complex<long_double>::operator*=(&local_a8,&local_58);
              lVar5 = (longdouble)
                      CONCAT28(local_a8._M_value._8_2_,
                               CONCAT44(local_a8._M_value._4_4_,local_a8._M_value._0_4_)) + lVar5;
              lVar4 = (longdouble)
                      CONCAT28(local_a8._M_value._24_2_,
                               CONCAT44(local_a8._M_value._20_4_,local_a8._M_value._16_4_)) + lVar4;
              lVar2 = lVar2 + 1;
            } while (lVar3 != lVar2);
          }
          lVar2 = local_80;
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_78,B,lVar3,local_80);
          local_a8._M_value._8_2_ = SUB42(local_78[2],0);
          local_a8._M_value._10_2_ = SUB42((uint)local_78[2] >> 0x10,0);
          local_a8._M_value._12_4_ = local_78[3];
          local_a8._M_value._24_2_ = SUB42(local_78[6],0);
          local_a8._M_value._26_2_ = SUB42((uint)local_78[6] >> 0x10,0);
          local_a8._M_value._28_4_ = local_78[7];
          lVar5 = (longdouble)CONCAT28(local_a8._M_value._8_2_,CONCAT44(local_78[1],local_78[0])) -
                  lVar5;
          lVar4 = (longdouble)CONCAT28(local_a8._M_value._24_2_,CONCAT44(local_78[5],local_78[4])) -
                  lVar4;
          local_a8._M_value._0_4_ = SUB104(lVar5,0);
          local_a8._M_value._4_4_ = SUB104((unkuint10)lVar5 >> 0x20,0);
          local_a8._M_value._8_2_ = SUB102((unkuint10)lVar5 >> 0x40,0);
          local_a8._M_value._16_4_ = SUB104(lVar4,0);
          local_a8._M_value._20_4_ = SUB104((unkuint10)lVar4 >> 0x20,0);
          local_a8._M_value._24_2_ = SUB102((unkuint10)lVar4 >> 0x40,0);
          (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(B,lVar3,lVar2,&local_a8);
          lVar2 = lVar2 + 1;
        } while (lVar2 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol);
      }
      lVar3 = lVar3 + 1;
      iVar1 = (*(local_88->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(local_88);
    } while (lVar3 < CONCAT44(extraout_var_01,iVar1));
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}